

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O3

shared_ptr<Assimp::FIDoubleValue> __thiscall
Assimp::FIDoubleValue::create(FIDoubleValue *this,vector<double,_std::allocator<double>_> *value)

{
  pointer pdVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<Assimp::FIDoubleValue> sVar2;
  
  pdVar1 = (pointer)operator_new(0x58);
  pdVar1[1] = 2.12199579145934e-314;
  *pdVar1 = (double)&PTR___Sp_counted_ptr_inplace_0089e530;
  pdVar1[3] = 0.0;
  pdVar1[4] = 0.0;
  pdVar1[5] = 0.0;
  pdVar1[2] = (double)&PTR_toString_abi_cxx11__0089e580;
  pdVar1[6] = (double)(pdVar1 + 8);
  pdVar1[7] = 0.0;
  *(undefined1 *)(pdVar1 + 8) = 0;
  *(undefined1 *)(pdVar1 + 10) = 0;
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            ((vector<double,_std::allocator<double>_> *)(pdVar1 + 3),value);
  (this->super_FIValue)._vptr_FIValue = (_func_int **)(pdVar1 + 2);
  (this->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = pdVar1;
  sVar2.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<Assimp::FIDoubleValue>)
         sVar2.super___shared_ptr<Assimp::FIDoubleValue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<FIDoubleValue> FIDoubleValue::create(std::vector<double> &&value) {
    return std::make_shared<FIDoubleValueImpl>(std::move(value));
}